

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strtr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pObj;
  bool bVar1;
  char *zString;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  SyBlob **pLen;
  int c;
  int nLen;
  int tlen;
  int flen;
  int local_78;
  sxu32 local_74;
  SyBlob local_70;
  SyBlob *local_50;
  code *local_48;
  
  if (nArg < 1) {
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    (pObj->x).rVal = 0.0;
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  }
  else {
    zString = jx9_value_to_string(*apArg,(int *)&local_74);
    if (nArg != 1 && 0 < (int)local_74) {
      if ((nArg == 2) && ((apArg[1]->iFlags & 0x40) != 0)) {
        local_70.pAllocator = &pCtx->pVm->sAllocator;
        local_70.pBlob = (char *)0x0;
        local_70.nByte = 0;
        local_70.mByte = 0;
        local_70.nFlags = 0;
        SyBlobAppend(&local_70,zString,local_74);
        local_48 = SyBlobSearch;
        local_50 = &local_70;
        if ((apArg[1]->iFlags & 0x40) != 0) {
          jx9HashmapWalk((jx9_hashmap *)(apArg[1]->x).pOther,StringReplaceWalker,&local_50);
        }
        jx9_value_string(pCtx->pRet,(char *)local_70.pBlob,local_70.nByte);
        if ((local_70.nFlags & 6) != 0) {
          return 0;
        }
        if (local_70.mByte == 0) {
          return 0;
        }
        SyMemBackendFree(local_70.pAllocator,local_70.pBlob);
        return 0;
      }
      if (2 < nArg) {
        pLen = &local_50;
        pcVar2 = jx9_value_to_string(apArg[1],(int *)pLen);
        pcVar3 = jx9_value_to_string(apArg[2],(int *)&local_70);
        if ((0 < (int)local_50) && (0 < (int)local_70.pAllocator)) {
          if ((int)local_74 < 1) {
            return 0;
          }
          lVar5 = 0;
          do {
            local_78 = (int)zString[lVar5];
            if (0 < (long)(int)local_50) {
              uVar4 = 0;
              do {
                if (pcVar2[uVar4] == zString[lVar5]) {
                  bVar1 = true;
                  pLen = (SyBlob **)(uVar4 & 0xffffffff);
                  goto LAB_00133970;
                }
                uVar4 = uVar4 + 1;
              } while ((long)(int)local_50 != uVar4);
            }
            bVar1 = false;
LAB_00133970:
            if (bVar1) {
              if ((int)pLen < (int)local_70.pAllocator) {
                local_78 = (int)pcVar3[(int)pLen];
              }
            }
            jx9_value_string(pCtx->pRet,(char *)&local_78,1);
            lVar5 = lVar5 + 1;
            if ((int)local_74 <= lVar5) {
              return 0;
            }
          } while( true );
        }
      }
    }
    jx9_value_string(pCtx->pRet,zString,local_74);
  }
  return 0;
}

Assistant:

static int jx9Builtin_strtr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Nothing to replace, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 || nArg < 2 ){
		/* Invalid arguments */
		jx9_result_string(pCtx, zIn, nLen);
		return JX9_OK;
	}
	if( nArg == 2 && jx9_value_is_json_array(apArg[1]) ){
		str_replace_data sRepData;
		SyBlob sWorker;
		/* Initilaize the working buffer */
		SyBlobInit(&sWorker, &pCtx->pVm->sAllocator);
		/* Copy raw string */
		SyBlobAppend(&sWorker, (const void *)zIn, (sxu32)nLen);
		/* Init our replace data instance */
		sRepData.pWorker = &sWorker;
		sRepData.xMatch = SyBlobSearch;
		/* Iterate throw array entries and perform the replace operation.*/
		jx9_array_walk(apArg[1], StringReplaceWalker, &sRepData);
		/* All done, return the result string */
		jx9_result_string(pCtx, (const char *)SyBlobData(&sWorker), 
			(int)SyBlobLength(&sWorker)); /* Will make it's own copy */
		/* Clean-up */
		SyBlobRelease(&sWorker);
	}else{
		int i, flen, tlen, c, iOfft;
		const char *zFrom, *zTo;
		if( nArg < 3 ){
			/* Nothing to replace */
			jx9_result_string(pCtx, zIn, nLen);
			return JX9_OK;
		}
		/* Extract given arguments */
		zFrom = jx9_value_to_string(apArg[1], &flen);
		zTo = jx9_value_to_string(apArg[2], &tlen);
		if( flen < 1 || tlen < 1 ){
			/* Nothing to replace */
			jx9_result_string(pCtx, zIn, nLen);
			return JX9_OK;
		}
		/* Start the replace process */
		for( i = 0 ; i < nLen ; ++i ){
			c = zIn[i];
			if( CheckMask(c, zFrom, flen, &iOfft) ){
				if ( iOfft < tlen ){
					c = zTo[iOfft];
				}
			}
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			
		}
	}
	return JX9_OK;
}